

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O1

void __thiscall
helics::apps::SineGenerator::set(SineGenerator *this,string_view parameter,double val)

{
  long lVar1;
  int iVar2;
  char *__s1;
  size_t __n;
  size_type __rlen;
  
  __s1 = parameter._M_str;
  __n = parameter._M_len;
  lVar1 = __n - 1;
  switch(lVar1) {
  case 0:
switchD_0020fcee_caseD_0:
    iVar2 = bcmp(__s1,"f",__n);
    if (iVar2 == 0) goto LAB_0020ff26;
    switch(lVar1) {
    case 0:
      goto switchD_0020fdbe_caseD_0;
    default:
      goto switchD_0020fcee_caseD_1;
    case 2:
      goto switchD_0020fcee_caseD_2;
    case 3:
      goto switchD_0020fdbe_caseD_3;
    case 4:
      goto switchD_0020fcee_caseD_4;
    case 5:
      goto switchD_0020fcee_caseD_5;
    case 8:
      goto switchD_0020fd56_caseD_8;
    }
  default:
    goto switchD_0020fcee_caseD_1;
  case 2:
    goto switchD_0020fcee_caseD_2;
  case 3:
switchD_0020fcee_caseD_3:
    iVar2 = bcmp(__s1,"freq",__n);
    if (iVar2 == 0) goto LAB_0020ff26;
    switch(lVar1) {
    case 0:
      goto switchD_0020fcee_caseD_0;
    default:
      goto switchD_0020fcee_caseD_1;
    case 2:
      goto switchD_0020fcee_caseD_2;
    case 3:
      goto switchD_0020fdbe_caseD_3;
    case 4:
      goto switchD_0020fcee_caseD_4;
    case 5:
      goto switchD_0020fcee_caseD_5;
    case 8:
      goto switchD_0020fd56_caseD_8;
    }
  case 4:
switchD_0020fcee_caseD_4:
    iVar2 = bcmp(__s1,"level",__n);
    if (iVar2 == 0) {
      this->level = val;
      return;
    }
    if (__n == 6) {
switchD_0020fdbe_caseD_5:
      iVar2 = bcmp(__s1,"offset",__n);
      if (iVar2 == 0) {
        this->offset = val;
        return;
      }
    }
switchD_0020fcee_caseD_1:
    SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
    return;
  case 5:
switchD_0020fcee_caseD_5:
    iVar2 = bcmp(__s1,"period",__n);
    if (iVar2 == 0) {
      val = 1.0 / val;
LAB_0020ff26:
      this->frequency = val;
      return;
    }
    switch(lVar1) {
    case 0:
switchD_0020fdbe_caseD_0:
      iVar2 = bcmp(__s1,"a",__n);
      if (iVar2 == 0) {
LAB_0020ff01:
        this->amplitude = val;
        return;
      }
      if (__n != 6) {
        if (__n != 5) goto switchD_0020fcee_caseD_1;
        goto switchD_0020fcee_caseD_4;
      }
      break;
    default:
      goto switchD_0020fcee_caseD_1;
    case 2:
switchD_0020fcee_caseD_2:
      iVar2 = bcmp(__s1,"amp",__n);
      if (iVar2 == 0) goto LAB_0020ff01;
      if (__n != 6) {
        if (__n != 5) {
          if (__n != 1) goto switchD_0020fcee_caseD_1;
          goto switchD_0020fdbe_caseD_0;
        }
        goto switchD_0020fcee_caseD_4;
      }
      break;
    case 3:
switchD_0020fdbe_caseD_3:
      iVar2 = bcmp(__s1,"dfdt",__n);
      if (iVar2 == 0) {
        this->dfdt = val;
        return;
      }
      switch(lVar1) {
      case 0:
        goto switchD_0020fdbe_caseD_0;
      default:
        goto switchD_0020fcee_caseD_1;
      case 2:
        goto switchD_0020fcee_caseD_2;
      case 3:
        iVar2 = bcmp(__s1,"dadt",__n);
        if (iVar2 == 0) {
          this->dAdt = val;
          return;
        }
        switch(lVar1) {
        case 0:
          goto switchD_0020fdbe_caseD_0;
        default:
          goto switchD_0020fcee_caseD_1;
        case 2:
          goto switchD_0020fcee_caseD_2;
        case 4:
          goto switchD_0020fcee_caseD_4;
        case 5:
          break;
        case 8:
          goto switchD_0020fd56_caseD_8;
        }
      case 4:
        goto switchD_0020fcee_caseD_4;
      case 5:
        break;
      case 8:
        goto switchD_0020fd56_caseD_8;
      }
    case 4:
      goto switchD_0020fcee_caseD_4;
    case 5:
      break;
    case 8:
switchD_0020fd56_caseD_8:
      iVar2 = bcmp(__s1,"amplitude",__n);
      if (iVar2 == 0) goto LAB_0020ff01;
      switch(lVar1) {
      case 0:
        goto switchD_0020fdbe_caseD_0;
      default:
        goto switchD_0020fcee_caseD_1;
      case 2:
        goto switchD_0020fcee_caseD_2;
      case 4:
        goto switchD_0020fcee_caseD_4;
      case 5:
        break;
      }
    }
    goto switchD_0020fdbe_caseD_5;
  case 8:
    iVar2 = bcmp(__s1,"frequency",__n);
    if (iVar2 == 0) goto LAB_0020ff26;
    switch(lVar1) {
    case 0:
      goto switchD_0020fcee_caseD_0;
    default:
      goto switchD_0020fcee_caseD_1;
    case 2:
      goto switchD_0020fcee_caseD_2;
    case 3:
      goto switchD_0020fcee_caseD_3;
    case 4:
      goto switchD_0020fcee_caseD_4;
    case 5:
      goto switchD_0020fcee_caseD_5;
    case 8:
      goto switchD_0020fd56_caseD_8;
    }
  }
}

Assistant:

void SineGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "level") {
            level = val;
        } else if (parameter == "offset") {
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }